

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

optional<double> __thiscall slang::strToDouble(slang *this,string_view str,size_t *pos)

{
  int *piVar1;
  undefined8 unaff_RBP;
  ulong uVar2;
  optional<double> oVar3;
  char *end;
  string copy;
  char *local_60;
  char *local_58 [4];
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  local_38._M_str = (char *)str._M_len;
  local_38._M_len = (size_t)this;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_58,&local_38,(allocator<char> *)&local_60);
  piVar1 = __errno_location();
  *piVar1 = 0;
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload._M_value = strtod(local_58[0],&local_60);
  if ((local_58[0] == local_60) || (*piVar1 == 0x22)) {
    uVar2 = 0;
  }
  else {
    uVar2 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    if ((long *)str._M_str != (long *)0x0) {
      *(long *)str._M_str = (long)local_60 - (long)local_58[0];
    }
  }
  std::__cxx11::string::~string((string *)local_58);
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _8_8_ = uVar2 & 0xffffffff;
  return (optional<double>)
         oVar3.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

std::optional<double> strToDouble(std::string_view str, size_t* pos) {
    std::string copy(str);
    const char* start = copy.c_str();

    char* end;
    errno = 0;
    double val = strtod(start, &end);

    if (start == end || errno == ERANGE)
        return std::nullopt;

    if (pos)
        *pos = size_t(end - start);
    return val;
}